

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O1

void verb_prog_tilt_scales(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *txt;
  OBJ_AFFECT_DATA oaf;
  OBJ_AFFECT_DATA OStack_78;
  
  if (obj->value[1] == 2) {
    txt = "You cannot tilt the scales again yet.\n\r";
    goto LAB_002e0191;
  }
  if (*argument != '\0') {
    iVar1 = obj->value[2];
    iVar2 = strcmp(argument,"left");
    if (iVar2 != 0) {
      iVar3 = strcmp(argument,"right");
      if (iVar3 != 0) goto LAB_002e018a;
      if (iVar2 != 0) goto LAB_002e0205;
    }
    if (iVar1 == 0) {
      send_to_char("The scales are already tilted to the left.\n\r",ch);
    }
    if (obj->value[2] == 1) {
      obj->value[2] = 0;
      send_to_char("You tilt the scales so that the left side is weighted...\n\r",ch);
    }
    if (obj->value[2] == 2) {
      obj->value[2] = 1;
      send_to_char("You tilt the scales to the left, balancing them...\n\r",ch);
    }
LAB_002e0205:
    iVar2 = strcmp(argument,"right");
    if (iVar2 == 0) {
      if (obj->value[2] == 2) {
        send_to_char("The scales are already tilted to the right.\n\r",ch);
      }
      if (obj->value[2] == 1) {
        obj->value[2] = 2;
        send_to_char("You tilt the scales so that the right side is weighted...\n\r",ch);
      }
      if (obj->value[2] == 0) {
        obj->value[2] = 1;
        send_to_char("You tilt the scales to the right, balancing them...\n\r",ch);
      }
    }
    if (iVar1 != obj->value[2]) {
      init_affect_obj(&OStack_78);
      OStack_78.where = 0;
      OStack_78.duration = 0xc;
      OStack_78.level = ch->level;
      OStack_78.location = 2;
      OStack_78.modifier = 1;
      OStack_78.type = gsn_bash;
      OStack_78.aftype = 1;
      OStack_78.owner = ch;
      affect_to_obj(obj,&OStack_78);
    }
    return;
  }
LAB_002e018a:
  txt = "You can tilt the scales to the left or right.\n\r";
LAB_002e0191:
  send_to_char(txt,ch);
  return;
}

Assistant:

void verb_prog_tilt_scales(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	OBJ_AFFECT_DATA oaf;
	int difference = obj->value[2];

	if (obj->value[1] == 2)
	{
		send_to_char("You cannot tilt the scales again yet.\n\r", ch);
		return;
	}

	if (!argument[0] || (strcmp(argument, "left") && strcmp(argument, "right")))
	{
		send_to_char("You can tilt the scales to the left or right.\n\r", ch);
		return;
	}

	if (!strcmp(argument, "left"))
	{
		if (obj->value[2] == 0)
			send_to_char("The scales are already tilted to the left.\n\r", ch);

		if (obj->value[2] == 1)
		{
			obj->value[2]--;
			send_to_char("You tilt the scales so that the left side is weighted...\n\r", ch);
		}

		if (obj->value[2] == 2)
		{
			obj->value[2]--;
			send_to_char("You tilt the scales to the left, balancing them...\n\r", ch);
		}
	}

	if (!strcmp(argument, "right"))
	{
		if (obj->value[2] == 2)
			send_to_char("The scales are already tilted to the right.\n\r", ch);

		if (obj->value[2] == 1)
		{
			obj->value[2]++;
			send_to_char("You tilt the scales so that the right side is weighted...\n\r", ch);
		}

		if (obj->value[2] == 0)
		{
			obj->value[2]++;
			send_to_char("You tilt the scales to the right, balancing them...\n\r", ch);
		}
	}

	if (difference != obj->value[2])
	{
		init_affect_obj(&oaf);
		oaf.where = TO_OBJ_AFFECTS;
		oaf.duration = 12;
		oaf.level = ch->level;
		oaf.modifier = 1;
		oaf.location = APPLY_OBJ_V1;
		oaf.type = gsn_bash;
		oaf.aftype = AFT_SKILL;
		oaf.owner = ch;
		affect_to_obj(obj, &oaf);
	}
}